

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O3

ushort __thiscall QLocale::toUShort(QLocale *this,QStringView s,bool *ok)

{
  QLocalePrivate *pQVar1;
  ushort uVar2;
  QSimpleParsedNumber<unsigned_long_long> QVar3;
  
  pQVar1 = (this->d).d.ptr;
  QVar3 = QLocaleData::stringToUnsLongLong
                    (pQVar1->m_data,s,10,
                     (NumberOptions)
                     (pQVar1->m_numberOptions).super_QFlagsStorageHelper<QLocale::NumberOption,_4>.
                     super_QFlagsStorage<QLocale::NumberOption>.i);
  if (ok != (bool *)0x0) {
    *ok = 0 < QVar3.used && QVar3.result < 0x10000;
  }
  uVar2 = 0;
  if (QVar3.result < 0x10000) {
    uVar2 = (ushort)QVar3.result;
  }
  return uVar2;
}

Assistant:

ushort QLocale::toUShort(QStringView s, bool *ok) const
{
    return toIntegral_helper<ushort>(d, s, ok);
}